

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<8,_8192>::Reset(ObjectBlockPool<8,_8192> *this)

{
  LargeBlock<8,_8192> *pLVar1;
  
  if (this->activePages != (MyLargeBlock *)0x0) {
    do {
      pLVar1 = this->activePages->next;
      NULLC::alignedDealloc(this->activePages);
      this->activePages = pLVar1;
    } while (pLVar1 != (LargeBlock<8,_8192> *)0x0);
    this->freeBlocks = &this->lastBlock;
    this->activePages = (MyLargeBlock *)0x0;
    this->lastNum = 0x2000;
    if ((this->sortedPages).data != (LargeBlock<8,_8192> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->sortedPages).data = (LargeBlock<8,_8192> **)0x0;
    (this->sortedPages).max = 0;
    (this->sortedPages).count = 0;
    if ((this->objectsToFinalize).data != (SmallBlock<8> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->objectsToFinalize).data = (SmallBlock<8> **)0x0;
    (this->objectsToFinalize).max = 0;
    (this->objectsToFinalize).count = 0;
    if ((this->objectsToFree).data != (SmallBlock<8> **)0x0) {
      (*(code *)NULLC::dealloc)();
    }
    (this->objectsToFree).data = (SmallBlock<8> **)0x0;
    (this->objectsToFree).max = 0;
    (this->objectsToFree).count = 0;
  }
  return;
}

Assistant:

void Reset()
	{
		if(!activePages)
			return;
		do
		{
			MyLargeBlock* following = activePages->next;
			NULLC::alignedDealloc(activePages);
			activePages = following;
		}while(activePages != NULL);

		freeBlocks = &lastBlock;
		activePages = NULL;
		lastNum = countInBlock;

		sortedPages.reset();
		objectsToFinalize.reset();
		objectsToFree.reset();
	}